

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvatiming.c
# Opt level: O1

void time_pwm_nv50(uint cnum)

{
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  bool bVar7;
  timeval end;
  timeval start;
  timeval local_50;
  timeval local_40;
  
  uVar6 = 0;
  do {
    lVar1 = uVar6 * 8;
    pvVar4 = nva_cards[(int)cnum]->bar0;
    uVar2 = *(undefined4 *)((long)pvVar4 + uVar6 * 8 + 0xe114);
    uVar3 = *(uint *)((long)pvVar4 + uVar6 * 8 + 0xe118);
    *(undefined4 *)((long)pvVar4 + uVar6 * 8 + 0xe114) = 0x200000;
    *(undefined4 *)((long)pvVar4 + uVar6 * 8 + 0xe118) = 0x80080000;
    do {
    } while (*(int *)((long)pvVar4 + lVar1 + 0xe118) < 0);
    *(undefined4 *)((long)pvVar4 + lVar1 + 0xe118) = 0x80080000;
    do {
    } while (*(int *)((long)pvVar4 + lVar1 + 0xe118) < 0);
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    pvVar4 = nva_cards[(int)cnum]->bar0;
    *(undefined4 *)((long)pvVar4 + lVar1 + 0xe118) = 0x80080000;
    do {
    } while (*(int *)((long)pvVar4 + lVar1 + 0xe118) < 0);
    gettimeofday(&local_50,(__timezone_ptr_t)0x0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (local_50.tv_usec - local_40.tv_usec) +
                   (local_50.tv_sec - local_40.tv_sec) * 1000000;
    printf("PWM %d: %dHz\n",uVar6 & 0xffffffff,
           (ulong)SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1e848000000)) / auVar5,0));
    pvVar4 = nva_cards[(int)cnum]->bar0;
    *(undefined4 *)((long)pvVar4 + uVar6 * 8 + 0xe114) = uVar2;
    *(uint *)((long)pvVar4 + uVar6 * 8 + 0xe118) = uVar3 | 0x80000000;
    bVar7 = uVar6 == 0;
    uVar6 = uVar6 + 1;
  } while (bVar7);
  return;
}

Assistant:

void time_pwm_nv50(unsigned int cnum)
{
	int i;
	for (i = 0; i < 2; i++) {
		uint32_t a = 0xe114 + i * 8;
		uint32_t b = a + 4;
		uint32_t save0 = nva_rd32(cnum, a);
		uint32_t save1 = nva_rd32(cnum, b);

		struct timeval start, end;

		nva_wr32(cnum, a, 0x200000);
		nva_wr32(cnum, b, 0x80080000);
		while (nva_rd32(cnum, b) & 0x80000000);
		nva_wr32(cnum, b, 0x80080000);
		while (nva_rd32(cnum, b) & 0x80000000);
		gettimeofday(&start, NULL);
		nva_wr32(cnum, b, 0x80080000);
		while (nva_rd32(cnum, b) & 0x80000000);
		gettimeofday(&end, NULL);
		uint64_t td = (time_diff_us(start, end));
		printf("PWM %d: %dHz\n", i, (int)(1000000ll * 0x200000 / td));
		nva_wr32(cnum, a, save0);
		nva_wr32(cnum, b, 0x80000000 | save1);
	}
}